

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcher.cpp
# Opt level: O3

void FileWatcherRemoveAllWatches(HFileWatcher handle)

{
  long *plVar1;
  uint uVar2;
  pointer pbVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  ulong uVar4;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RSI;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  ulong uVar5;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__result;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  long *plVar8;
  long *plVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  
  uVar2 = pthread_mutex_lock((pthread_mutex_t *)((long)handle + 0x38));
  if (uVar2 != 0) {
    this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(ulong)uVar2;
    std::__throw_system_error(uVar2);
    if (in_RSI != this) {
      __first._M_current =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)in_RSI;
      __last._M_current =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 8);
      uVar4 = (long)__last._M_current - (long)__first._M_current;
      __n = (long)uVar4 >> 5;
      pbVar6 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
      if ((ulong)(*(long *)(this + 0x10) - (long)pbVar6) < uVar4) {
        pbVar3 = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_allocate_and_copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           (this,__n,__first,__last);
        plVar9 = *(long **)this;
        plVar1 = *(long **)(this + 8);
        if (plVar9 != plVar1) {
          plVar9 = plVar9 + 2;
          do {
            if (plVar9 != (long *)plVar9[-2]) {
              operator_delete((long *)plVar9[-2],*plVar9 + 1);
            }
            plVar8 = plVar9 + 2;
            plVar9 = plVar9 + 4;
          } while (plVar8 != plVar1);
          plVar9 = *(long **)this;
        }
        if (plVar9 != (long *)0x0) {
          operator_delete(plVar9,*(long *)(this + 0x10) - (long)plVar9);
        }
        *(pointer *)this = pbVar3;
        *(ulong *)(this + 0x10) = (long)pbVar3 + uVar4;
      }
      else {
        __result = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8)
        ;
        uVar5 = (long)__result - (long)pbVar6;
        if (uVar5 < uVar4) {
          if (0 < (long)uVar5 >> 5) {
            uVar5 = ((long)uVar5 >> 5) + 1;
            do {
              std::__cxx11::string::_M_assign((string *)pbVar6);
              pbVar6 = pbVar6 + 1;
              uVar5 = uVar5 - 1;
            } while (1 < uVar5);
            __first._M_current =
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)in_RSI;
            __last._M_current =
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 8)
            ;
            __result = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (this + 8);
            uVar5 = (long)__result - *(long *)this;
          }
          std::__uninitialized_copy<false>::
          __uninit_copy<std::__cxx11::string*,std::__cxx11::string*>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((__first._M_current)->_M_dataplus)._M_p + uVar5),__last._M_current,
                     __result);
        }
        else {
          pbVar10 = pbVar6;
          if (0 < (long)__n) {
            uVar5 = __n + 1;
            do {
              std::__cxx11::string::_M_assign((string *)pbVar10);
              pbVar10 = pbVar10 + 1;
              uVar5 = uVar5 - 1;
            } while (1 < uVar5);
            __result = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (this + 8);
            pbVar6 = pbVar6 + __n;
          }
          if (pbVar10 != __result) {
            paVar7 = &pbVar6->field_2;
            do {
              plVar9 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar7 + -1))->_M_dataplus)._M_p;
              if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)plVar9) {
                operator_delete(plVar9,paVar7->_M_allocated_capacity + 1);
              }
              pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (paVar7 + 1);
              paVar7 = paVar7 + 2;
            } while (pbVar6 != __result);
          }
        }
      }
      *(ulong *)(this + 8) = uVar4 + *(long *)this;
    }
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)handle + 0x10),*(pointer *)((long)handle + 0x10));
  pthread_mutex_unlock((pthread_mutex_t *)((long)handle + 0x38));
  return;
}

Assistant:

void FileWatcherRemoveAllWatches(HFileWatcher handle) {
    FileWatcher* watcher = (FileWatcher*)handle;
    std::lock_guard<std::mutex> guard(watcher->Mutex);
    watcher->Watches.clear();
}